

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBoxAlgo.h
# Opt level: O1

Box<Imath_3_2::Vec3<float>_> *
Imath_3_2::transform<float,float>(Box<Imath_3_2::Vec3<float>_> *box,Matrix44<float> *m)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar9;
  float fVar10;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  int i;
  long lVar11;
  Box<Imath_3_2::Vec3<float>_> *in_RDI;
  float *pfVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined8 uVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float afStack_70 [2];
  Vec3<float> points [8];
  
  points[3].x = (box->min).x;
  points[7].x = (box->max).x;
  if (((points[3].x <= points[7].x) &&
      (fVar16 = (box->min).y, pfVar12 = &(box->max).y, fVar16 < *pfVar12 || fVar16 == *pfVar12)) &&
     (fVar16 = (box->min).z, pfVar12 = &(box->max).z, fVar16 < *pfVar12 || fVar16 == *pfVar12)) {
    fVar4 = (box->min).y;
    fVar9 = (box->min).z;
    if ((((points[7].x != 3.4028235e+38) || (NAN(points[7].x))) ||
        ((points[3].x != -3.4028235e+38 || ((NAN(points[3].x) || (fVar4 != -3.4028235e+38)))))) ||
       ((NAN(fVar4) ||
        (((((fVar16 = (box->max).y, fVar16 != 3.4028235e+38 || (NAN(fVar16))) ||
           (fVar9 != -3.4028235e+38)) ||
          ((NAN(fVar9) || (fVar16 = (box->max).z, fVar16 != 3.4028235e+38)))) || (NAN(fVar16)))))))
    {
      fVar16 = m->x[0][3];
      if ((((fVar16 != 0.0) || (NAN(fVar16))) ||
          ((fVar17 = m->x[1][3], fVar17 != 0.0 ||
           (((NAN(fVar17) || (fVar17 = m->x[2][3], fVar17 != 0.0)) || (NAN(fVar17))))))) ||
         ((fVar17 = m->x[3][3], fVar17 != 1.0 || (NAN(fVar17))))) {
        points[2].x = points[3].x;
        points[1].x = points[3].x;
        points[0].x = points[3].x;
        points[6].x = points[7].x;
        points[5].x = points[7].x;
        points[4].x = points[7].x;
        points[5].y = fVar4;
        points[1].y = fVar4;
        points[6].z = fVar9;
        points[4].y = fVar4;
        points[4].z = fVar9;
        points[2].z = fVar9;
        points[0].y = fVar4;
        points[0].z = fVar9;
        fVar5 = (box->max).y;
        fVar10 = (box->max).z;
        points[6].y = fVar5;
        points[2].y = fVar5;
        points[7].y = fVar5;
        points[7].z = fVar10;
        points[5].z = fVar10;
        points[3].y = fVar5;
        points[3].z = fVar10;
        points[1].z = fVar10;
        fVar17 = 3.4028235e+38;
        fVar18 = 3.4028235e+38;
        fVar24 = 3.4028235e+38;
        fVar23 = -3.4028235e+38;
        (in_RDI->min).x = 3.4028235e+38;
        (in_RDI->min).y = 3.4028235e+38;
        (in_RDI->min).z = 3.4028235e+38;
        (in_RDI->max).x = -3.4028235e+38;
        auVar22 = _DAT_00166350;
        uVar19 = DAT_00166350;
        (in_RDI->max).y = (float)(int)uVar19;
        (in_RDI->max).z = (float)(int)((ulong)uVar19 >> 0x20);
        uVar19 = *(undefined8 *)(m->x[0] + 1);
        uVar6 = *(undefined8 *)(m->x[1] + 1);
        uVar7 = *(undefined8 *)(m->x[2] + 1);
        uVar8 = *(undefined8 *)(m->x[3] + 1);
        lVar11 = 8;
        do {
          fVar1 = *(float *)((long)afStack_70 + lVar11);
          fVar2 = *(float *)((long)afStack_70 + lVar11 + 4);
          fVar3 = *(float *)((long)&points[0].x + lVar11);
          fVar26 = fVar3 * m->x[2][3] + fVar1 * fVar16 + fVar2 * m->x[1][3] + m->x[3][3];
          fVar25 = (fVar3 * m->x[2][0] + fVar1 * m->x[0][0] + fVar2 * m->x[1][0] + m->x[3][0]) /
                   fVar26;
          auVar20._0_4_ =
               fVar3 * (float)uVar7 + fVar1 * (float)uVar19 + fVar2 * (float)uVar6 + (float)uVar8;
          auVar20._4_4_ =
               fVar3 * (float)((ulong)uVar7 >> 0x20) +
               fVar1 * (float)((ulong)uVar19 >> 0x20) + fVar2 * (float)((ulong)uVar6 >> 0x20) +
               (float)((ulong)uVar8 >> 0x20);
          auVar20._8_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
          auVar20._12_4_ = fVar3 * 0.0 + fVar1 * 0.0 + fVar2 * 0.0 + 0.0;
          auVar21._4_4_ = fVar26;
          auVar21._0_4_ = fVar26;
          auVar21._8_4_ = fVar26;
          auVar21._12_4_ = fVar26;
          auVar21 = divps(auVar20,auVar21);
          uVar14 = -(uint)(auVar21._0_4_ < fVar18);
          uVar15 = -(uint)(auVar21._4_4_ < fVar24);
          fVar17 = (float)(~-(uint)(fVar25 < fVar17) & (uint)fVar17 |
                          (uint)fVar25 & -(uint)(fVar25 < fVar17));
          fVar18 = (float)(~uVar14 & (uint)fVar18 | (uint)auVar21._0_4_ & uVar14);
          fVar24 = (float)(~uVar15 & (uint)fVar24 | (uint)auVar21._4_4_ & uVar15);
          fVar23 = (float)(~-(uint)(fVar23 < fVar25) & (uint)fVar23 |
                          (uint)fVar25 & -(uint)(fVar23 < fVar25));
          auVar22 = maxps(auVar21,auVar22);
          lVar11 = lVar11 + 0xc;
        } while (lVar11 != 0x68);
        (in_RDI->min).x = fVar17;
        (in_RDI->min).y = fVar18;
        (in_RDI->min).z = fVar24;
        (in_RDI->max).x = fVar23;
        (in_RDI->max).y = (float)(int)auVar22._0_8_;
        (in_RDI->max).z = (float)(int)((ulong)auVar22._0_8_ >> 0x20);
      }
      else {
        (in_RDI->min).x = 3.4028235e+38;
        (in_RDI->min).y = 3.4028235e+38;
        *(undefined8 *)&(in_RDI->min).z = 0xff7fffff7f7fffff;
        (in_RDI->max).y = -3.4028235e+38;
        (in_RDI->max).z = -3.4028235e+38;
        lVar11 = 0;
        pfVar12 = (float *)m;
        do {
          fVar16 = m->x[3][lVar11];
          (&(in_RDI->max).x)[lVar11] = fVar16;
          (&(in_RDI->min).x)[lVar11] = fVar16;
          lVar13 = 0;
          fVar17 = fVar16;
          do {
            fVar23 = *(float *)((long)&(box->min).x + lVar13) * pfVar12[lVar13];
            fVar18 = pfVar12[lVar13] * *(float *)((long)&(box->max).x + lVar13);
            fVar24 = fVar23;
            if (fVar18 <= fVar23) {
              fVar24 = fVar18;
            }
            fVar16 = fVar16 + fVar24;
            if (fVar18 <= fVar23) {
              fVar18 = fVar23;
            }
            fVar17 = fVar17 + fVar18;
            lVar13 = lVar13 + 4;
          } while (lVar13 != 0xc);
          (&(in_RDI->min).x)[lVar11] = fVar16;
          (&(in_RDI->max).x)[lVar11] = fVar17;
          lVar11 = lVar11 + 1;
          pfVar12 = pfVar12 + 1;
        } while (lVar11 != 3);
      }
      return in_RDI;
    }
  }
  (in_RDI->min).x = points[3].x;
  fVar16 = (box->min).z;
  (in_RDI->min).y = (box->min).y;
  (in_RDI->min).z = fVar16;
  (in_RDI->max).x = points[7].x;
  fVar16 = (box->max).z;
  (in_RDI->max).y = (box->max).y;
  (in_RDI->max).z = fVar16;
  return in_RDI;
}

Assistant:

IMATH_HOSTDEVICE Box<Vec3<S>>
transform (const Box<Vec3<S>>& box, const Matrix44<T>& m) IMATH_NOEXCEPT
{
    if (box.isEmpty () || box.isInfinite ()) return box;

    //
    // If the last column of m is (0 0 0 1) then m is an affine
    // transform, and we use the fast Graphics Gems trick.
    //

    if (m[0][3] == 0 && m[1][3] == 0 && m[2][3] == 0 && m[3][3] == 1)
    {
        Box<Vec3<S>> newBox;

        for (int i = 0; i < 3; i++)
        {
            newBox.min[i] = newBox.max[i] = (S) m[3][i];

            for (int j = 0; j < 3; j++)
            {
                S a, b;

                a = (S) m[j][i] * box.min[j];
                b = (S) m[j][i] * box.max[j];

                if (a < b)
                {
                    newBox.min[i] += a;
                    newBox.max[i] += b;
                }
                else
                {
                    newBox.min[i] += b;
                    newBox.max[i] += a;
                }
            }
        }

        return newBox;
    }

    //
    // M is a projection matrix.  Do things the naive way:
    // Transform the eight corners of the box, and find an
    // axis-parallel box that encloses the transformed corners.
    //

    Vec3<S> points[8];

    points[0][0] = points[1][0] = points[2][0] = points[3][0] = box.min[0];
    points[4][0] = points[5][0] = points[6][0] = points[7][0] = box.max[0];

    points[0][1] = points[1][1] = points[4][1] = points[5][1] = box.min[1];
    points[2][1] = points[3][1] = points[6][1] = points[7][1] = box.max[1];

    points[0][2] = points[2][2] = points[4][2] = points[6][2] = box.min[2];
    points[1][2] = points[3][2] = points[5][2] = points[7][2] = box.max[2];

    Box<Vec3<S>> newBox;

    for (int i = 0; i < 8; i++)
        newBox.extendBy (points[i] * m);

    return newBox;
}